

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getColName(Highs *this,HighsInt col,string *name)

{
  size_type sVar1;
  const_reference pvVar2;
  string *in_RDX;
  uint in_ESI;
  long in_RDI;
  HighsInt num_col_name;
  HighsInt num_col;
  HighsStatus local_4;
  
  if (((int)in_ESI < 0) || ((int)*(uint *)(in_RDI + 0x138) <= (int)in_ESI)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Index %d for column name is outside the range [0, num_col = %d)\n",(ulong)in_ESI,
                 (ulong)*(uint *)(in_RDI + 0x138));
    local_4 = kError;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x280));
    if ((int)in_ESI < (int)sVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x280),(long)(int)in_ESI);
      std::__cxx11::string::operator=(in_RDX,(string *)pvVar2);
      local_4 = kOk;
    }
    else {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Index %d for column name is outside the range [0, num_col_name = %d)\n",
                   (ulong)in_ESI,sVar1 & 0xffffffff);
      local_4 = kError;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getColName(const HighsInt col, std::string& name) const {
  const HighsInt num_col = this->model_.lp_.num_col_;
  if (col < 0 || col >= num_col) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for column name is outside the range [0, num_col = %d)\n",
        int(col), int(num_col));
    return HighsStatus::kError;
  }
  const HighsInt num_col_name = this->model_.lp_.col_names_.size();
  if (col >= num_col_name) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Index %d for column name is outside the range [0, "
                 "num_col_name = %d)\n",
                 int(col), int(num_col_name));
    return HighsStatus::kError;
  }
  name = this->model_.lp_.col_names_[col];
  return HighsStatus::kOk;
}